

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_tests.cpp
# Opt level: O0

void __thiscall fs_tests::fsbridge_pathtostring::test_method(fsbridge_pathtostring *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  string invalid_u8_str;
  u8string str8;
  string u8_str;
  char *in_stack_fffffffffffff9b8;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
  *in_stack_fffffffffffff9c0;
  char *in_stack_fffffffffffff9c8;
  undefined7 in_stack_fffffffffffff9e0;
  undefined1 in_stack_fffffffffffff9e7;
  path *in_stack_fffffffffffff9e8;
  string *in_stack_fffffffffffff9f0;
  const_string *file;
  undefined7 in_stack_fffffffffffff9f8;
  undefined1 in_stack_fffffffffffff9ff;
  char *in_stack_fffffffffffffa00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa08;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_4d4;
  allocator<char> local_471;
  undefined1 local_470 [16];
  undefined1 local_460 [64];
  undefined1 local_420 [16];
  undefined1 local_410 [64];
  const_string local_3d0 [2];
  lazy_ostream local_3b0 [2];
  assertion_result local_390 [2];
  undefined1 local_358 [16];
  undefined1 local_348 [64];
  undefined1 local_308 [16];
  undefined1 local_2f8 [64];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [71];
  allocator<char> local_261 [41];
  undefined1 local_238 [32];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_218 [2];
  undefined1 local_1d0 [72];
  undefined1 local_188 [144];
  undefined1 local_f8 [72];
  undefined1 local_b0 [72];
  undefined1 local_68 [64];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  std::allocator<char>::~allocator(local_261);
  std::allocator<char8_t>::allocator((allocator<char8_t> *)in_stack_fffffffffffff9b8);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>
            ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
             in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             (allocator<char8_t> *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  std::allocator<char8_t>::~allocator((allocator<char8_t> *)in_stack_fffffffffffff9b8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
               (const_string *)in_stack_fffffffffffff9f0,(size_t)in_stack_fffffffffffff9e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9c0,(char (*) [1])in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    fs::PathFromString(&in_stack_fffffffffffff9e8->_M_pathname);
    fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffff9c0);
    in_stack_fffffffffffff9c8 = "u8_str";
    in_stack_fffffffffffff9c0 = &local_28;
    in_stack_fffffffffffff9b8 = "fs::PathToString(fs::PathFromString(u8_str))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_2a8,local_2b8,0x15,1,2,local_68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9b8);
    fs::path::~path((path *)in_stack_fffffffffffff9b8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff9b8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
               (const_string *)in_stack_fffffffffffff9f0,(size_t)in_stack_fffffffffffff9e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9c0,(char (*) [1])in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    fs::u8path(in_stack_fffffffffffff9f0);
    fs::path::utf8string_abi_cxx11_((path *)in_stack_fffffffffffffa08);
    in_stack_fffffffffffff9c8 = "u8_str";
    in_stack_fffffffffffff9c0 = &local_28;
    in_stack_fffffffffffff9b8 = "fs::u8path(u8_str).utf8string()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_2f8,local_308,0x16,1,2,local_b0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9b8);
    fs::path::~path((path *)in_stack_fffffffffffff9b8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff9b8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
               (const_string *)in_stack_fffffffffffff9f0,(size_t)in_stack_fffffffffffff9e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9c0,(char (*) [1])in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    fs::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
              ((path *)in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
               (format)((ulong)in_stack_fffffffffffff9b8 >> 0x38));
    fs::path::utf8string_abi_cxx11_((path *)in_stack_fffffffffffffa08);
    in_stack_fffffffffffff9c8 = "u8_str";
    in_stack_fffffffffffff9c0 = &local_28;
    in_stack_fffffffffffff9b8 = "fs::path(str8).utf8string()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_348,local_358,0x17,1,2,local_f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9b8);
    fs::path::~path((path *)in_stack_fffffffffffff9b8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff9b8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
               (const_string *)in_stack_fffffffffffff9f0,(size_t)in_stack_fffffffffffff9e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
    fs::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
              ((path *)in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,
               (format)((ulong)in_stack_fffffffffffff9b8 >> 0x38));
    std::filesystem::__cxx11::path::u8string_abi___u8_(in_stack_fffffffffffff9e8);
    std::operator==((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
                    in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff9c8,
               SUB81((ulong)in_stack_fffffffffffff9c0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9c0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    in_stack_fffffffffffff9b8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_390,local_3b0,local_3d0,0x18,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff9b8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff9b8);
    std::__cxx11::u8string::~u8string
              ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
               in_stack_fffffffffffff9b8);
    fs::path::~path((path *)in_stack_fffffffffffff9b8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
               (const_string *)in_stack_fffffffffffff9f0,(size_t)in_stack_fffffffffffff9e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9c0,(char (*) [1])in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    fs::PathFromString(&in_stack_fffffffffffff9e8->_M_pathname);
    fs::path::utf8string_abi_cxx11_((path *)in_stack_fffffffffffffa08);
    in_stack_fffffffffffff9c8 = "u8_str";
    in_stack_fffffffffffff9c0 = &local_28;
    in_stack_fffffffffffff9b8 = "fs::PathFromString(u8_str).utf8string()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_410,local_420,0x19,1,2,local_188);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9b8);
    fs::path::~path((path *)in_stack_fffffffffffff9b8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff9b8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
               (const_string *)in_stack_fffffffffffff9f0,(size_t)in_stack_fffffffffffff9e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9c0,(char (*) [1])in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    fs::u8path(in_stack_fffffffffffff9f0);
    fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffff9c0);
    in_stack_fffffffffffff9c8 = "u8_str";
    in_stack_fffffffffffff9c0 = &local_28;
    in_stack_fffffffffffff9b8 = "fs::PathToString(fs::u8path(u8_str))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_460,local_470,0x1a,1,2,local_1d0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9b8);
    fs::path::~path((path *)in_stack_fffffffffffff9b8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff9b8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa08,in_stack_fffffffffffffa00,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  std::allocator<char>::~allocator(&local_471);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),
               (const_string *)in_stack_fffffffffffff9f0,(size_t)in_stack_fffffffffffff9e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9c0,(char (*) [1])in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    local_4d4._4_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffff9b8);
    local_4d4._M_dataplus._M_p._0_4_ = 1;
    in_stack_fffffffffffff9c8 = "1";
    in_stack_fffffffffffff9c0 = &local_4d4;
    in_stack_fffffffffffff9b8 = "invalid_u8_str.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              ((undefined1 *)((long)&local_4d4.field_2 + 0xc),
               (undefined1 *)((long)&local_4d4._M_string_length + 4),0x23,1,2,
               (undefined1 *)((long)&local_4d4._M_dataplus._M_p + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff9b8);
    in_stack_fffffffffffff9ff = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff9ff);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),file
               ,(size_t)in_stack_fffffffffffff9e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff9e7,in_stack_fffffffffffff9e0));
    in_stack_fffffffffffff9e8 = (path *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9c0,(char (*) [1])in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    fs::PathFromString(&in_stack_fffffffffffff9e8->_M_pathname);
    fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffff9c0);
    in_stack_fffffffffffff9c8 = "invalid_u8_str";
    in_stack_fffffffffffff9c0 = local_218;
    in_stack_fffffffffffff9b8 = "fs::PathToString(fs::PathFromString(invalid_u8_str))";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&stack0xfffffffffffffae8,&stack0xfffffffffffffad8,0x24,1,2,local_238);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9b8);
    fs::path::~path((path *)in_stack_fffffffffffff9b8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff9b8);
    in_stack_fffffffffffff9e7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff9e7);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9b8);
  std::__cxx11::u8string::~u8string
            ((basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)
             in_stack_fffffffffffff9b8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9b8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(fsbridge_pathtostring)
{
    std::string u8_str = "fs_tests_₿_🏃";
    std::u8string str8{u8"fs_tests_₿_🏃"};
    BOOST_CHECK_EQUAL(fs::PathToString(fs::PathFromString(u8_str)), u8_str);
    BOOST_CHECK_EQUAL(fs::u8path(u8_str).utf8string(), u8_str);
    BOOST_CHECK_EQUAL(fs::path(str8).utf8string(), u8_str);
    BOOST_CHECK(fs::path(str8).u8string() == str8);
    BOOST_CHECK_EQUAL(fs::PathFromString(u8_str).utf8string(), u8_str);
    BOOST_CHECK_EQUAL(fs::PathToString(fs::u8path(u8_str)), u8_str);
#ifndef WIN32
    // On non-windows systems, verify that arbitrary byte strings containing
    // invalid UTF-8 can be round tripped successfully with PathToString and
    // PathFromString. On non-windows systems, paths are just byte strings so
    // these functions do not do any encoding. On windows, paths are Unicode,
    // and these functions do encoding and decoding, so the behavior of this
    // test would be undefined.
    std::string invalid_u8_str = "\xf0";
    BOOST_CHECK_EQUAL(invalid_u8_str.size(), 1);
    BOOST_CHECK_EQUAL(fs::PathToString(fs::PathFromString(invalid_u8_str)), invalid_u8_str);
#endif
}